

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O2

optional<sai::VirtualFileEntry> * __thiscall
sai::VirtualFileSystem::GetEntry
          (optional<sai::VirtualFileEntry> *__return_storage_ptr__,VirtualFileSystem *this,
          char *Path)

{
  uint uVar1;
  int iVar2;
  char *__s1;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  VirtualPage *pVVar6;
  string CurPath;
  VirtualPage TablePage;
  VirtualPage CurPage;
  
  memset(&CurPage,0,0x1000);
  Read<sai::VirtualPage>(this,0x2000,&CurPage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&CurPath,Path,(allocator<char> *)&TablePage.u8);
  __s1 = strtok(CurPath._M_dataplus._M_p,"./");
  uVar3 = 0;
LAB_00107f70:
  pVVar6 = &CurPage;
  lVar4 = 0x40;
  do {
    if (((lVar4 == 0) || ((pVVar6->u32)._M_elems[0] == 0)) || (__s1 == (char *)0x0)) {
LAB_0010805d:
      (__return_storage_ptr__->super__Optional_base<sai::VirtualFileEntry,_false,_false>)._M_payload
      .super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
LAB_00108066:
      std::__cxx11::string::~string((string *)&CurPath);
      return __return_storage_ptr__;
    }
    iVar2 = strcmp(__s1,(pVVar6->i8)._M_elems + 4);
    if (iVar2 == 0) {
      __s1 = strtok((char *)0x0,"./");
      if (__s1 == (char *)0x0) {
        std::_Optional_payload_base<sai::VirtualFileEntry>::
        _Optional_payload_base<std::shared_ptr<sai::ifstream>&,sai::FATEntry&>
                  ((_Optional_payload_base<sai::VirtualFileEntry> *)__return_storage_ptr__,this,
                   pVVar6);
        goto LAB_00108066;
      }
      if ((pVVar6->u8)._M_elems[0x26] != '\x10') goto LAB_0010805d;
      uVar1 = (pVVar6->u32)._M_elems[10];
      Read<sai::VirtualPage>(this,(ulong)uVar1 << 0xc,&CurPage);
      uVar3 = (ulong)uVar1;
      goto LAB_00107f70;
    }
    if ((lVar4 == 1) && (uVar3 != 0)) {
      memset(&TablePage,0,0x1000);
      Read<sai::VirtualPage>(this,(ulong)((uint)uVar3 & 0xfffffe00) << 0xc,&TablePage);
      uVar5 = (ulong)*(uint *)((long)&TablePage + uVar3 * 8 + 4);
      if (uVar5 != 0) break;
    }
    pVVar6 = (VirtualPage *)((pVVar6->u8)._M_elems + 0x40);
    lVar4 = lVar4 + -1;
  } while( true );
  Read<sai::VirtualPage>(this,uVar5 << 0xc,&CurPage);
  uVar3 = uVar5;
  goto LAB_00107f70;
}

Assistant:

std::optional<VirtualFileEntry> VirtualFileSystem::GetEntry(const char* Path)
{
	VirtualPage CurPage = {};
	Read(2 * VirtualPage::PageSize, CurPage);

	std::string CurPath(Path);
	const char* PathDelim    = "./";
	const char* CurToken     = std::strtok(&CurPath[0], PathDelim);
	std::size_t CurEntry     = 0;
	std::size_t CurPageIndex = 0;

	while( CurEntry < 64 && CurPage.FATEntries[CurEntry].Flags && CurToken )
	{
		if( std::strcmp(CurToken, CurPage.FATEntries[CurEntry].Name) == 0 )
		{
			// Match
			if( (CurToken = std::strtok(nullptr, PathDelim)) == nullptr )
			{
				// No more tokens, done
				return std::make_optional<VirtualFileEntry>(
					FileStream, CurPage.FATEntries[CurEntry]
				);
			}
			// Try to go further
			if( CurPage.FATEntries[CurEntry].Type != FATEntry::EntryType::Folder )
			{
				// Part of the path was not a folder, cant go further
				return std::nullopt;
			}

			const std::uint32_t PageIndex = CurPage.FATEntries[CurEntry].PageIndex;
			Read(PageIndex * VirtualPage::PageSize, CurPage);
			CurEntry     = 0;
			CurPageIndex = PageIndex;
			continue;
		}

		// Last entry ( of this Page ), check if there are more after this.
		if( CurEntry == 63 && CurPageIndex )
		{
			// If a folder has more than 64 `FATEntries`, the `NextPageIndex`
			// field on the `PageEntry` will indicate on what `Page` the extra
			// entries are located.
			VirtualPage TablePage = {};
			Read(VirtualPage::NearestTableIndex(CurPageIndex) * VirtualPage::PageSize, TablePage);

			const std::uint32_t NextPageIndex = TablePage.PageEntries[CurPageIndex].NextPageIndex;
			if( NextPageIndex )
			{
				Read(NextPageIndex * VirtualPage::PageSize, CurPage);
				CurEntry     = 0;
				CurPageIndex = NextPageIndex;
				continue;
			}
		}

		CurEntry++;
	}

	return std::nullopt;
}